

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deflate.h
# Opt level: O0

void __thiscall DeflateDecoder::DeflateDecoder(DeflateDecoder *this,string *message)

{
  string local_38;
  string *local_18;
  string *message_local;
  DeflateDecoder *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)message);
  Cryptor::Cryptor(&this->super_Cryptor,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__DeflateDecoder_00123ca8;
  return;
}

Assistant:

explicit DeflateDecoder(const std::string& message) : Cryptor(message) {}